

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall CDirectiveHeaderSize::exec(CDirectiveHeaderSize *this)

{
  int iVar1;
  undefined4 extraout_var;
  shared_ptr<GenericAssemblerFile> file;
  shared_ptr<AssemblerFile> openFile;
  
  std::__shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&openFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>,
             &(g_fileManager->activeFile).
              super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>);
  iVar1 = (*(openFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            _vptr_AssemblerFile[0xc])();
  if ((char)iVar1 == '\0') {
    Logger::printError<>(Error,"Header size not applicable for this file");
  }
  else {
    std::static_pointer_cast<GenericAssemblerFile,AssemblerFile>((shared_ptr<AssemblerFile> *)&file)
    ;
    iVar1 = (*((file.super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_AssemblerFile)._vptr_AssemblerFile[7])();
    (file.super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->headerSize =
         this->headerSize;
    (*((file.super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      super_AssemblerFile)._vptr_AssemblerFile[10])
              (file.super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               CONCAT44(extraout_var,iVar1));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file.super___shared_ptr<GenericAssemblerFile,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&openFile.super___shared_ptr<AssemblerFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void CDirectiveHeaderSize::exec() const
{
	std::shared_ptr<AssemblerFile> openFile = g_fileManager->getOpenFile();
	if (!openFile->hasFixedVirtualAddress())
	{
		Logger::printError(Logger::Error, "Header size not applicable for this file");
		return;
	}
	std::shared_ptr<GenericAssemblerFile> file = std::static_pointer_cast<GenericAssemblerFile>(openFile);
	int64_t physicalAddress = file->getPhysicalAddress();
	file->setHeaderSize(headerSize);
	file->seekPhysical(physicalAddress);
}